

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1502.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  undefined8 uVar9;
  timeval tVar10;
  undefined8 uStack_280;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdwrite;
  fd_set fdread;
  fd_set fdexcep;
  char redirect [160];
  
  curl_msnprintf(redirect,0xa0,"google.com:%s:%s",libtest_arg2,libtest_arg3);
  tv_test_start = tutil_tvnow();
  lVar2 = curl_slist_append(0,redirect);
  if (lVar2 == 0) {
    curl_mfprintf(_stderr,"curl_slist_append() failed\n");
    iVar1 = 0x7e;
    goto LAB_00102494;
  }
  iVar1 = curl_global_init(3);
  uVar9 = _stderr;
  if (iVar1 == 0) {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      lVar6 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1502.c"
                    ,0x46);
      iVar1 = 0x7c;
      lVar5 = 0;
      goto LAB_00102477;
    }
    iVar1 = curl_easy_setopt(lVar4,0x2712,URL);
    uVar9 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar4,0x2a,1);
      uVar9 = _stderr;
      if (iVar1 != 0) {
        uVar3 = curl_easy_strerror(iVar1);
        uStack_280 = 0x49;
        goto LAB_00102463;
      }
      iVar1 = curl_easy_setopt(lVar4,0x27db,lVar2);
      uVar9 = _stderr;
      if (iVar1 != 0) {
        uVar3 = curl_easy_strerror(iVar1);
        uStack_280 = 0x4a;
        goto LAB_00102463;
      }
      lVar5 = curl_easy_duphandle(lVar4);
      if (lVar5 == 0) {
        curl_slist_free_all(lVar2);
        curl_easy_cleanup(lVar4);
        iVar1 = 0x1b;
        goto LAB_00102494;
      }
      curl_easy_cleanup(lVar4);
      lVar6 = curl_multi_init();
      if (lVar6 == 0) {
        lVar6 = 0;
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1502.c"
                      ,0x57);
        iVar1 = 0x7b;
      }
      else {
        iVar1 = curl_multi_add_handle(lVar6,lVar5);
        uVar9 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_multi_perform(lVar6,&still_running);
          uVar9 = _stderr;
          if (iVar1 == 0) {
            if (still_running < 0) {
              pcVar8 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uStack_280 = 0x5b;
LAB_00102727:
              curl_mfprintf(_stderr,pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1502.c"
                            ,uStack_280);
              iVar1 = 0x7a;
            }
            else {
              tVar10 = tutil_tvnow();
              lVar4 = tutil_tvdiff(tVar10,tv_test_start);
              if (lVar4 < 0xea61) {
                if (still_running == 0) {
                  iVar1 = 0;
                }
                else {
                  do {
                    maxfd = -99;
                    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
                      fdread.__fds_bits[lVar4] = 0;
                    }
                    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
                      fdwrite.__fds_bits[lVar4] = 0;
                    }
                    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
                      fdexcep.__fds_bits[lVar4] = 0;
                    }
                    timeout.tv_sec = 1;
                    timeout.tv_usec = 0;
                    iVar1 = curl_multi_fdset(lVar6,&fdread,&fdwrite,&fdexcep,&maxfd);
                    uVar9 = _stderr;
                    if (iVar1 != 0) {
                      uVar3 = curl_multi_strerror(iVar1);
                      pcVar8 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                      uStack_280 = 0x6c;
                      goto LAB_00102579;
                    }
                    if (maxfd < -1) {
                      pcVar8 = 
                      "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                      ;
                      uStack_280 = 0x6c;
                      goto LAB_00102727;
                    }
                    iVar1 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&timeout);
                    if (iVar1 == -1) {
                      piVar7 = __errno_location();
                      uVar9 = _stderr;
                      iVar1 = *piVar7;
                      pcVar8 = strerror(iVar1);
                      curl_mfprintf(uVar9,"%s:%d select() failed, with errno %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1502.c"
                                    ,0x70,iVar1,pcVar8);
                      iVar1 = 0x79;
                      break;
                    }
                    tVar10 = tutil_tvnow();
                    lVar4 = tutil_tvdiff(tVar10,tv_test_start);
                    if (60000 < lVar4) {
                      uStack_280 = 0x72;
                      goto LAB_00102750;
                    }
                    iVar1 = curl_multi_perform(lVar6,&still_running);
                    uVar9 = _stderr;
                    if (iVar1 != 0) {
                      uVar3 = curl_multi_strerror(iVar1);
                      pcVar8 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                      uStack_280 = 0x74;
                      goto LAB_00102579;
                    }
                    if (still_running < 0) {
                      pcVar8 = 
                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                      ;
                      uStack_280 = 0x74;
                      goto LAB_00102727;
                    }
                    tVar10 = tutil_tvnow();
                    lVar4 = tutil_tvdiff(tVar10,tv_test_start);
                    if (60000 < lVar4) {
                      uStack_280 = 0x76;
                      goto LAB_00102750;
                    }
                    iVar1 = 0;
                  } while (still_running != 0);
                }
              }
              else {
                uStack_280 = 0x5d;
LAB_00102750:
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1502.c"
                              ,uStack_280);
                iVar1 = 0x7d;
              }
            }
            goto LAB_00102477;
          }
          uVar3 = curl_multi_strerror(iVar1);
          pcVar8 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uStack_280 = 0x5b;
        }
        else {
          uVar3 = curl_multi_strerror(iVar1);
          pcVar8 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
          uStack_280 = 0x59;
        }
LAB_00102579:
        curl_mfprintf(uVar9,pcVar8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1502.c"
                      ,uStack_280,iVar1,uVar3);
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar1);
      uStack_280 = 0x48;
LAB_00102463:
      lVar6 = 0;
      curl_mfprintf(uVar9,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1502.c"
                    ,uStack_280,iVar1,uVar3);
      lVar5 = lVar4;
    }
LAB_00102477:
    curl_multi_cleanup(lVar6);
    curl_easy_cleanup(lVar5);
    curl_global_cleanup();
  }
  else {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar9,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1502.c"
                  ,0x40,iVar1,uVar3);
  }
  curl_slist_free_all(lVar2);
LAB_00102494:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURL *dup;
  CURLM *multi = NULL;
  int still_running;
  int res = 0;

  char redirect[160];

  /* DNS cache injection */
  struct curl_slist *dns_cache_list;

  msnprintf(redirect, sizeof(redirect), "google.com:%s:%s", libtest_arg2,
            libtest_arg3);

  start_test_timing();

  dns_cache_list = curl_slist_append(NULL, redirect);
  if(!dns_cache_list) {
    fprintf(stderr, "curl_slist_append() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    curl_slist_free_all(dns_cache_list);
    return res;
  }

  easy_init(easy);

  easy_setopt(easy, CURLOPT_URL, URL);
  easy_setopt(easy, CURLOPT_HEADER, 1L);
  easy_setopt(easy, CURLOPT_RESOLVE, dns_cache_list);

  dup = curl_easy_duphandle(easy);
  if(dup) {
    curl_easy_cleanup(easy);
    easy = dup;
  }
  else {
    curl_slist_free_all(dns_cache_list);
    curl_easy_cleanup(easy);
    return CURLE_OUT_OF_MEMORY;
  }

  multi_init(multi);

  multi_add_handle(multi, easy);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

#ifdef LIB1502
  /* undocumented cleanup sequence - type UA */
  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();
#endif

#ifdef LIB1503
  /* proper cleanup sequence - type PA */
  curl_multi_remove_handle(multi, easy);
  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();
#endif

#ifdef LIB1504
  /* undocumented cleanup sequence - type UB */
  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
#endif

#ifdef LIB1505
  /* proper cleanup sequence - type PB */
  curl_multi_remove_handle(multi, easy);
  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
#endif

  curl_slist_free_all(dns_cache_list);

  return res;
}